

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void * kv_thread(void *args)

{
  fdb_status fVar1;
  ulong uVar2;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  timeval __test_begin;
  fdb_snapshot_info_t *local_30;
  ulong local_28;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  fVar1 = fdb_get_all_snap_markers(*args,&local_30,&local_28);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    for (uVar2 = 0; uVar2 < local_28; uVar2 = uVar2 + 10) {
      load_persons((storage_t *)args);
    }
    fdb_free_snap_markers(local_30,local_28);
    return (void *)0x0;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
          ,0x493);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x493,"void *kv_thread(void *)");
}

Assistant:

void *kv_thread(void *args) {
    // This thread stores and indexes person docs

    TEST_INIT();
    uint64_t i;
    uint64_t num_markers;
    fdb_snapshot_info_t *markers;
    fdb_status status;

    storage_t *st = (storage_t *)args;
    status = fdb_get_all_snap_markers(st->main, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i = 0; i < num_markers; i += 10) {
        load_persons(st);
    }
    fdb_free_snap_markers(markers, num_markers);
    return NULL;
}